

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void __thiscall SpanList::pushFront(SpanList *this,Span *span)

{
  Span *span_local;
  SpanList *this_local;
  
  if (this->list == (Span *)0x0) {
    this->list = span;
    this->list->next = this->list;
    this->list->prev = this->list;
  }
  else {
    this->list->prev->next = span;
    span->prev = this->list->prev;
    this->list->prev = span;
    span->next = this->list;
    this->list = span;
  }
  return;
}

Assistant:

void SpanList::pushFront(Span *span) {
  if (list == nullptr) {
    list = span;
    list->next = list;
    list->prev = list;
  } else {
    list->prev->next = span;
    span->prev = list->prev;
    list->prev = span;
    span->next = list;

    list = span; // 这一步非常重要
  }
}